

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cc
# Opt level: O0

string * onmt::Tokenizer::mode_to_str_abi_cxx11_(Mode mode)

{
  char *__s;
  invalid_argument *this;
  uint in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  allocator<char> local_d [13];
  
  __s = (char *)(ulong)in_ESI;
  switch(__s) {
  case (char *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe2);
    break;
  case (char *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_d);
    break;
  case (char *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  case (char *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe0);
    break;
  case (char *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffe0,__s,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe1);
    break;
  default:
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid tokenization mode");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return in_RDI;
}

Assistant:

std::string Tokenizer::mode_to_str(const Mode mode)
  {
    switch (mode)
    {
    case Mode::Aggressive:
      return "aggressive";
    case Mode::Char:
      return "char";
    case Mode::Conservative:
      return "conservative";
    case Mode::None:
      return "none";
    case Mode::Space:
      return "space";
    }
    throw std::invalid_argument("invalid tokenization mode");
  }